

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O2

void __thiscall amrex::ClusterList::chop(ClusterList *this,Real eff)

{
  _List_node_base *p_Var1;
  Real RVar2;
  Cluster *local_20;
  
  p_Var1 = (_List_node_base *)this;
  do {
    p_Var1 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var1->_M_next)->
             super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    while( true ) {
      if (p_Var1 == (_List_node_base *)this) {
        return;
      }
      RVar2 = Cluster::eff(*(Cluster **)(p_Var1 + 1));
      if (eff <= RVar2) break;
      local_20 = Cluster::chop(*(Cluster **)(p_Var1 + 1));
      std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::push_back
                (&this->lst,&local_20);
    }
  } while( true );
}

Assistant:

void
ClusterList::chop (Real eff)
{
    BL_PROFILE("ClusterList::chop()");

    for (std::list<Cluster*>::iterator cli = lst.begin(); cli != lst.end(); )
    {
        if ((*cli)->eff() < eff)
        {
            lst.push_back((*cli)->chop());
        }
        else
        {
            ++cli;
        }
    }
}